

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::get_sample_at
          (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this,double t,Sample **dst)

{
  __normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
  _Var1;
  double local_18;
  
  if (dst != (Sample **)0x0) {
    local_18 = t;
    if (this->_dirty == true) {
      update(this);
    }
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample*,std::vector<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample>>>,__gnu_cxx::__ops::_Iter_pred<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::get_sample_at(double,tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample**)::_lambda(tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample_const&)_1_>>
                      ((this->_samples).
                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_samples).
                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_18);
    if (_Var1._M_current !=
        (this->_samples).
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      *dst = _Var1._M_current;
    }
  }
  return false;
}

Assistant:

bool get_sample_at(const double t, Sample **dst) {
    if (!dst) {
      return false;
    }

    if (_dirty) {
      update();
    }

    const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &sample) {
      return math::is_close(t, sample.t);
    });

    if (it != _samples.end()) {
      (*dst) = &(*it); 
    }
    return false;
  }